

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t _elemsize;
  float *pfVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Layer *pLVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int _w;
  int iVar18;
  long lVar19;
  ulong uVar20;
  void *pvVar21;
  int i_1;
  float fVar22;
  int local_af4;
  int local_af0;
  void *local_ae8;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat weights [4];
  Mat bottom_blob_bordered;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar8 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar8;
  }
  iVar8 = this->kernel_w;
  iVar10 = this->kernel_h;
  if ((iVar10 == 1 && (iVar8 == 1 && bottom_blob->dims == 1)) &&
     (bottom_blob->w == this->weight_data_size / this->num_output)) {
    pLVar11 = create_layer(0xf);
    ParamDict::ParamDict((ParamDict *)&bottom_blob_bordered);
    ParamDict::set((ParamDict *)&bottom_blob_bordered,0,this->num_output);
    ParamDict::set((ParamDict *)&bottom_blob_bordered,1,this->bias_term);
    ParamDict::set((ParamDict *)&bottom_blob_bordered,2,this->weight_data_size);
    ParamDict::set((ParamDict *)&bottom_blob_bordered,8,this->int8_scale_term);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&bottom_blob_bordered);
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&weights[0].refcount + lVar12 + 4) = 0;
      *(undefined8 *)((long)&weights[0].elemsize + lVar12 + 4) = 0;
      *(undefined8 *)((long)&weights[0].data + lVar12) = 0;
      *(undefined8 *)((long)&weights[0].refcount + lVar12) = 0;
      *(undefined8 *)((long)&weights[0].allocator + lVar12) = 0;
      *(undefined8 *)((long)&weights[0].dims + lVar12) = 0;
      *(undefined8 *)((long)&weights[0].h + lVar12) = 0;
      *(undefined8 *)((long)&weights[0].cstep + lVar12) = 0;
      lVar12 = lVar12 + 0x40;
    } while (lVar12 != 0x100);
    Mat::operator=(weights,&this->weight_data);
    Mat::operator=(weights + 1,&this->bias_data);
    if (this->int8_scale_term != 0) {
      Mat::operator=(weights + 2,&this->weight_data_int8_scales);
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->bottom_blob_int8_scale;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x4;
      Mat::operator=(weights + 3,(Mat *)&_space_ofs);
      Mat::~Mat((Mat *)&_space_ofs);
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&_space_ofs,weights);
    (*pLVar11->_vptr_Layer[3])(pLVar11,&_space_ofs);
    ModelBin::~ModelBin((ModelBin *)&_space_ofs);
    (*pLVar11->_vptr_Layer[4])(pLVar11,opt);
    (*pLVar11->_vptr_Layer[7])(pLVar11,bottom_blob,top_blob,opt);
    (*pLVar11->_vptr_Layer[1])(pLVar11);
    lVar12 = 0xc0;
    do {
      Mat::~Mat((Mat *)((long)&weights[0].data + lVar12));
      lVar12 = lVar12 + -0x40;
    } while (lVar12 != -0x40);
    ParamDict::~ParamDict((ParamDict *)&bottom_blob_bordered);
    local_af0 = 0;
  }
  else {
    uVar3 = bottom_blob->c;
    _elemsize = bottom_blob->elemsize;
    iVar4 = this->dilation_w;
    iVar5 = this->dilation_h;
    bottom_blob_bordered.elemsize._0_4_ = 0;
    bottom_blob_bordered.elemsize._4_4_ = 0;
    bottom_blob_bordered.elempack = 0;
    bottom_blob_bordered.data = (void *)0x0;
    bottom_blob_bordered.refcount._0_4_ = 0;
    bottom_blob_bordered.refcount._4_4_ = 0;
    bottom_blob_bordered.allocator = (Allocator *)0x0;
    bottom_blob_bordered.dims = 0;
    bottom_blob_bordered.w = 0;
    bottom_blob_bordered.h = 0;
    bottom_blob_bordered.c = 0;
    bottom_blob_bordered.cstep = 0;
    make_padding(this,bottom_blob,&bottom_blob_bordered,opt);
    local_af0 = -100;
    if ((bottom_blob_bordered.data != (void *)0x0) &&
       ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
      iVar7 = bottom_blob_bordered.w;
      iVar4 = (~((iVar8 + -1) * iVar4) + bottom_blob_bordered.w) / this->stride_w;
      iVar5 = (~((iVar10 + -1) * iVar5) + bottom_blob_bordered.h) / this->stride_h;
      uVar9 = this->kernel_w * this->kernel_h;
      std::vector<int,_std::allocator<int>_>::vector
                (&_space_ofs,(long)(int)uVar9,(allocator_type *)weights);
      _w = iVar4 + 1;
      iVar8 = this->dilation_h;
      iVar10 = this->kernel_w;
      iVar13 = this->dilation_w * iVar10;
      iVar14 = 0;
      lVar12 = 0;
      for (iVar18 = 0; iVar18 < this->kernel_h; iVar18 = iVar18 + 1) {
        for (lVar19 = 0; (int)lVar19 < iVar10; lVar19 = lVar19 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar12 + lVar19] = iVar14;
          iVar14 = iVar14 + this->dilation_w;
          iVar10 = this->kernel_w;
        }
        iVar14 = iVar14 + (iVar7 * iVar8 - iVar13);
        lVar12 = (int)lVar12 + lVar19;
      }
      Mat::create(top_blob,_w,iVar5 + 1,this->num_output,_elemsize,opt->blob_allocator);
      local_af0 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_af0 = 0;
        uVar20 = 0;
        if (0 < (int)uVar9) {
          uVar20 = (ulong)uVar9;
        }
        uVar15 = 0;
        if (0 < (int)uVar3) {
          uVar15 = (ulong)uVar3;
        }
        local_af4 = 0;
        for (lVar12 = 0; lVar12 < this->num_output; lVar12 = lVar12 + 1) {
          Mat::channel(weights,top_blob,(int)lVar12);
          local_ae8 = weights[0].data;
          Mat::~Mat(weights);
          for (iVar8 = 0; iVar8 <= iVar5; iVar8 = iVar8 + 1) {
            for (lVar19 = 0; lVar19 <= iVar4; lVar19 = lVar19 + 1) {
              if (this->bias_term == 0) {
                fVar22 = 0.0;
              }
              else {
                fVar22 = *(float *)((long)(this->bias_data).data + lVar12 * 4);
              }
              pvVar21 = (void *)((long)(this->weight_data).data + (long)local_af4 * 4);
              for (uVar17 = 0; uVar17 != uVar15; uVar17 = uVar17 + 1) {
                weights[0].elemsize =
                     CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                              (undefined4)bottom_blob_bordered.elemsize);
                weights[0].data =
                     (void *)(bottom_blob_bordered.cstep * uVar17 * weights[0].elemsize +
                             (long)bottom_blob_bordered.data);
                weights[0].refcount = (int *)0x0;
                weights[0].elempack = bottom_blob_bordered.elempack;
                weights[0].allocator = bottom_blob_bordered.allocator;
                weights[0].dims = 2;
                weights[0].w = bottom_blob_bordered.w;
                weights[0].h = bottom_blob_bordered.h;
                weights[0].c = 1;
                weights[0].cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
                for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
                  fVar22 = fVar22 + *(float *)((long)pvVar21 + uVar16 * 4) *
                                    *(float *)((long)weights[0].data +
                                              (long)_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar16]
                                              * 4 + (long)this->stride_w * (long)(int)lVar19 * 4 +
                                                    (long)(bottom_blob_bordered.w * iVar8 *
                                                          this->stride_h) * weights[0].elemsize);
                }
                Mat::~Mat(weights);
                pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar9 * 4);
              }
              switch(this->activation_type) {
              case 1:
                if (fVar22 <= 0.0) {
                  fVar22 = 0.0;
                }
                break;
              case 2:
                fVar22 = fVar22 * (float)(~-(uint)(0.0 < fVar22) & *(this->activation_params).data |
                                         -(uint)(0.0 < fVar22) & 0x3f800000);
                break;
              case 3:
                pfVar6 = (float *)(this->activation_params).data;
                fVar1 = pfVar6[1];
                fVar2 = *pfVar6;
                if (fVar22 <= fVar2) {
                  fVar22 = fVar2;
                }
                if (fVar1 < fVar22) {
                  fVar22 = fVar1;
                }
                break;
              case 4:
                fVar22 = expf(-fVar22);
                fVar22 = 1.0 / (fVar22 + 1.0);
              }
              *(float *)((long)local_ae8 + lVar19 * 4) = fVar22;
            }
            local_ae8 = (void *)((long)local_ae8 + (long)_w * 4);
          }
          local_af4 = local_af4 + uVar3 * uVar9;
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    Mat::~Mat(&bottom_blob_bordered);
  }
  return local_af0;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                if (activation_type == 1)
                {
                    sum = std::max(sum, 0.f);
                }
                else if (activation_type == 2)
                {
                    float slope = activation_params[0];
                    sum = sum > 0.f ? sum : sum * slope;
                }
                else if (activation_type == 3)
                {
                    float min = activation_params[0];
                    float max = activation_params[1];
                    if (sum < min)
                        sum = min;
                    if (sum > max)
                        sum = max;
                }
                else if (activation_type == 4)
                {
                    sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}